

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

uint256 * ParseHashV(uint256 *__return_storage_ptr__,UniValue *v,string_view name)

{
  string *args;
  UniValue *pUVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view str;
  uint expected_len;
  optional<uint256> rv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  size_type local_70;
  undefined1 local_64 [20];
  undefined1 local_50 [32];
  bool local_30;
  long local_28;
  
  pcVar2 = name._M_str;
  local_64._4_8_ = name._M_len;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_64._12_8_ = pcVar2;
  args = UniValue::get_str_abi_cxx11_(v);
  str._M_str = pcVar2;
  str._M_len = (size_t)(args->_M_dataplus)._M_p;
  detail::FromHex<uint256>((optional<uint256> *)local_50,(detail *)args->_M_string_length,str);
  if (local_30 == true) {
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x10) =
         local_50._16_8_;
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x18) =
         local_50._24_8_;
    *(undefined8 *)(__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems = local_50._0_8_;
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 8) =
         local_50._8_8_;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_64._0_4_ = 0x40;
    if (args->_M_string_length == 0x40) {
      pUVar1 = (UniValue *)__cxa_allocate_exception(0x58);
      tinyformat::format<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                ((string *)local_50,(tinyformat *)"%s must be hexadecimal string (not \'%s\')",
                 local_64 + 4,(basic_string_view<char,_std::char_traits<char>_> *)args,in_R8);
      JSONRPCError(pUVar1,-8,(string *)local_50);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(pUVar1,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    else {
      pUVar1 = (UniValue *)__cxa_allocate_exception(0x58);
      local_70 = args->_M_string_length;
      tinyformat::
      format<std::basic_string_view<char,std::char_traits<char>>,unsigned_int,unsigned_long,std::__cxx11::string>
                ((string *)local_50,(tinyformat *)"%s must be of length %d (not %d, for \'%s\')",
                 local_64 + 4,(basic_string_view<char,_std::char_traits<char>_> *)local_64,
                 (uint *)&local_70,(unsigned_long *)args,in_stack_ffffffffffffff88);
      JSONRPCError(pUVar1,-8,(string *)local_50);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(pUVar1,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

uint256 ParseHashV(const UniValue& v, std::string_view name)
{
    const std::string& strHex(v.get_str());
    if (auto rv{uint256::FromHex(strHex)}) return *rv;
    if (auto expected_len{uint256::size() * 2}; strHex.length() != expected_len) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("%s must be of length %d (not %d, for '%s')", name, expected_len, strHex.length(), strHex));
    }
    throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("%s must be hexadecimal string (not '%s')", name, strHex));
}